

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O0

void __thiscall QDir::setSorting(QDir *this,SortFlags sort)

{
  QDirPrivate *pQVar1;
  Int in_ESI;
  long in_FS_OFFSET;
  QDirPrivate *unaff_retaddr;
  QDirPrivate *d;
  long lVar2;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = d_func((QDir *)0x27f309);
  QDirPrivate::clearCache(unaff_retaddr,(MetaDataClearing)((ulong)lVar2 >> 0x20));
  (pQVar1->sort).super_QFlagsStorageHelper<QDir::SortFlag,_4>.super_QFlagsStorage<QDir::SortFlag>.i
       = in_ESI;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDir::setSorting(SortFlags sort)
{
    Q_D(QDir);
    d->clearCache(QDirPrivate::KeepMetaData);
    d->sort = sort;
}